

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_mul>(float v0,float *ptr,int size0,int size1,int stride1)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  int j;
  int i;
  float sum;
  reduction_op_mul op;
  int local_2c;
  int local_28;
  float local_24;
  reduction_op_mul local_1d;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_24 = in_XMM0_Da;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
      local_24 = reduction_op_mul::operator()
                           (&local_1d,&local_24,(float *)(local_10 + (long)local_2c * 4));
    }
    local_10 = local_10 + (long)local_1c * 4;
  }
  return local_24;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int size1, int stride1)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size1; i++)
    {
        for (int j = 0; j < size0; j++)
        {
            sum = op(sum, ptr[j]);
        }
        ptr += stride1;
    }

    return sum;
}